

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

Value * duckdb::LoggingMode::GetSetting(Value *__return_storage_ptr__,ClientContext *context)

{
  DatabaseInstance *this;
  LogManager *this_00;
  string sStack_c8;
  LogConfig local_a8;
  
  this = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(&context->db);
  this_00 = DatabaseInstance::GetLogManager(this);
  LogManager::GetConfig(&local_a8,this_00);
  EnumUtil::ToString<duckdb::LogMode>(&sStack_c8,local_a8.mode);
  Value::Value(__return_storage_ptr__,&sStack_c8);
  ::std::__cxx11::string::~string((string *)&sStack_c8);
  LogConfig::~LogConfig(&local_a8);
  return __return_storage_ptr__;
}

Assistant:

Value LoggingMode::GetSetting(const ClientContext &context) {
	return EnumUtil::ToString(context.db->GetLogManager().GetConfig().mode);
}